

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

void anm_write(anm_archive_t *anm,char *filename)

{
  short sVar1;
  undefined4 uVar2;
  long *plVar3;
  char *pcVar4;
  uint *puVar5;
  ulong *buffer;
  uint uVar6;
  FILE *__stream;
  long lVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  long *plVar11;
  uint uVar12;
  size_t sVar13;
  short *buffer_00;
  list_node_t *plVar14;
  int iVar15;
  undefined8 *puVar16;
  ulong uVar17;
  undefined8 *puVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anm_instr0_t new_instr;
  undefined8 local_70;
  uint local_64;
  long local_60;
  long *local_58;
  list_node_t *local_50;
  ulong local_48;
  long *local_40;
  long local_38;
  
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    anm_write_cold_1();
    uVar17 = *(ulong *)filename;
    *(ulong *)filename =
         (ulong)(CONCAT24((short)((uint)*(undefined4 *)((long)filename + 4) >> 0x10),
                          *(undefined4 *)((long)filename + 4)) & 0xffff0000ffff);
    *(undefined4 *)((long)filename + 8) = 0;
    *(ulong *)((long)filename + 0xc) =
         (ulong)CONCAT24((short)((uint)*(undefined4 *)((long)filename + 10) >> 0x10),
                         *(undefined4 *)((long)filename + 10)) & 0xffffffff0000ffff;
    *(int *)((long)filename + 0x28) = (int)uVar17;
    uVar17 = *(ulong *)((long)filename + 0x18);
    *(undefined4 *)((long)filename + 0x18) = 0;
    *(int *)((long)filename + 0x1c) = (int)*(ulong *)((long)filename + 0x10);
    *(ulong *)((long)filename + 0x2c) = uVar17;
    *(ulong *)((long)filename + 0x34) = *(ulong *)((long)filename + 0x20);
    uVar2 = *(undefined4 *)((long)filename + 0x14);
    *(uint *)((long)filename + 0x14) = (uint)*(ushort *)((long)filename + 0xe);
    *(ulong *)((long)filename + 0x20) =
         (ulong)CONCAT24((short)((uint)uVar2 >> 0x10),uVar2) & 0xffffffff0000ffff;
    pcVar4 = (char *)((long)filename + 0x3c);
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    return;
  }
  plVar14 = (anm->entries).head;
  do {
    if (plVar14 == (list_node_t *)0x0) {
      fclose(__stream);
      return;
    }
    plVar3 = (long *)plVar14->data;
    lVar7 = file_tell((FILE *)__stream);
    sVar8 = strlen((char *)plVar3[2]);
    local_40 = plVar3 + 4;
    local_64 = 0xffffffff;
    uVar12 = 0;
    plVar11 = local_40;
    do {
      local_48 = (ulong)uVar12;
      plVar11 = (long *)*plVar11;
      local_64 = local_64 + 1;
      uVar12 = uVar12 + 1;
    } while (plVar11 != (long *)0x0);
    local_58 = plVar3 + 6;
    uVar12 = 0xffffffff;
    plVar11 = local_58;
    do {
      plVar11 = (long *)*plVar11;
      uVar12 = uVar12 + 1;
    } while (plVar11 != (long *)0x0);
    local_50 = plVar14;
    file_seek((FILE *)__stream,lVar7 + (ulong)local_64 * 4 + (ulong)uVar12 * 8 + 0x40);
    lVar9 = file_tell((FILE *)__stream);
    *(int *)(*plVar3 + 0x1c) = (int)lVar9 - (int)lVar7;
    pcVar4 = (char *)plVar3[2];
    local_60 = lVar7;
    sVar10 = strlen(pcVar4);
    file_write((FILE *)__stream,pcVar4,sVar10);
    file_write((FILE *)__stream,"",0x10 - (ulong)((uint)sVar8 & 0xf));
    if (((char *)plVar3[3] != (char *)0x0) && (*(int *)(*plVar3 + 0x28) == 0)) {
      sVar8 = strlen((char *)plVar3[3]);
      lVar7 = file_tell((FILE *)__stream);
      *(int *)(*plVar3 + 0x24) = (int)lVar7 - (int)local_60;
      pcVar4 = (char *)plVar3[3];
      sVar10 = strlen(pcVar4);
      file_write((FILE *)__stream,pcVar4,sVar10);
      file_write((FILE *)__stream,"",0x10 - (ulong)((uint)sVar8 & 0xf));
    }
    local_38 = file_tell((FILE *)__stream);
    for (puVar18 = (undefined8 *)*local_40; puVar18 != (undefined8 *)0x0;
        puVar18 = (undefined8 *)*puVar18) {
      file_write((FILE *)__stream,(void *)puVar18[2],0x14);
    }
    lVar7 = local_60;
    for (puVar18 = (undefined8 *)*local_58; iVar15 = (int)lVar7, local_60 = lVar7,
        puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)*puVar18) {
      plVar11 = (long *)puVar18[2];
      lVar7 = file_tell((FILE *)__stream);
      *(int *)(*plVar11 + 4) = (int)lVar7 - iVar15;
      for (puVar16 = (undefined8 *)plVar11[1]; uVar17 = local_70, puVar16 != (undefined8 *)0x0;
          puVar16 = (undefined8 *)*puVar16) {
        buffer_00 = (short *)puVar16[2];
        if (*(int *)(*plVar3 + 0x28) == 0) {
          local_70._4_4_ = SUB84(uVar17,4);
          local_70._0_4_ = CONCAT13((char)buffer_00[1],CONCAT12((char)*buffer_00,buffer_00[2]));
          file_write((FILE *)__stream,&local_70,4);
          sVar13 = local_70 >> 0x18 & 0xff;
          if (sVar13 != 0) {
            buffer_00 = buffer_00 + 4;
            goto LAB_0010839f;
          }
        }
        else {
          if (*buffer_00 == -1) {
            buffer_00[1] = 0;
            sVar13 = 8;
          }
          else {
            sVar1 = buffer_00[1];
            buffer_00[1] = sVar1 + 8U;
            sVar13 = (size_t)(ushort)(sVar1 + 8U);
          }
LAB_0010839f:
          file_write((FILE *)__stream,buffer_00,sVar13);
        }
      }
      if (*(int *)(*plVar3 + 0x28) == 0) {
        local_70 = local_70 & 0xffffffff00000000;
        sVar13 = 4;
      }
      else {
        local_70 = 0xffff;
        sVar13 = 8;
      }
      file_write((FILE *)__stream,&local_70,sVar13);
      lVar7 = local_60;
    }
    if (*(short *)(*plVar3 + 0x34) != 0) {
      lVar9 = file_tell((FILE *)__stream);
      *(int *)(*plVar3 + 0x30) = (int)lVar9 - iVar15;
      file_write((FILE *)__stream,(void *)plVar3[1],0x10);
      file_write((FILE *)__stream,(void *)plVar3[8],(ulong)*(uint *)(plVar3[1] + 0xc));
    }
    if (local_50->next == (list_node_t *)0x0) {
      uVar6 = 0;
    }
    else {
      lVar9 = file_tell((FILE *)__stream);
      uVar6 = (int)lVar9 - iVar15;
    }
    puVar5 = (uint *)*plVar3;
    puVar5[0xe] = uVar6;
    *puVar5 = local_64;
    puVar5[1] = uVar12;
    file_seek((FILE *)__stream,lVar7);
    buffer = (ulong *)*plVar3;
    uVar17 = buffer[5];
    if ((uint)uVar17 < 7) {
      file_write((FILE *)__stream,buffer,0x40);
    }
    else {
      buffer[5] = 0;
      buffer[6] = 0;
      buffer[7] = 0;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *buffer;
      auVar19 = pshuflw(auVar19,auVar19,0xe8);
      *(int *)((long)buffer + 4) = auVar19._0_4_;
      *(undefined2 *)(buffer + 1) = 0;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)((long)buffer + 0xc);
      auVar19 = pshuflw(auVar20,auVar20,0xe8);
      *(int *)((long)buffer + 10) = auVar19._0_4_;
      *(undefined2 *)((long)buffer + 0xe) = *(undefined2 *)((long)buffer + 0x14);
      *(undefined4 *)(buffer + 2) = *(undefined4 *)((long)buffer + 0x1c);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = buffer[4];
      auVar19 = pshuflw(auVar21,auVar21,0xe8);
      *(int *)((long)buffer + 0x14) = auVar19._0_4_;
      *(uint *)buffer = (uint)uVar17;
      buffer[3] = *(ulong *)((long)buffer + 0x2c);
      buffer[4] = *(ulong *)((long)buffer + 0x34);
      file_write((FILE *)__stream,(void *)*plVar3,0x40);
      convert_header_to_old((anm_header06_t *)*plVar3);
    }
    if (local_64 != 0) {
      iVar15 = (int)local_38 - iVar15;
      uVar17 = local_48 & 0xffffffff;
      do {
        local_70 = CONCAT44(local_70._4_4_,iVar15);
        file_write((FILE *)__stream,&local_70,4);
        iVar15 = iVar15 + 0x14;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    for (puVar18 = (undefined8 *)*local_58; puVar18 != (undefined8 *)0x0;
        puVar18 = (undefined8 *)*puVar18) {
      file_write((FILE *)__stream,*(void **)puVar18[2],8);
    }
    file_seek((FILE *)__stream,lVar7 + (ulong)*(uint *)(*plVar3 + 0x38));
    plVar14 = local_50->next;
  } while( true );
}

Assistant:

static void
anm_write(
    anm_archive_t* anm,
    const char* filename)
{
    FILE* stream;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
            argv0, filename, strerror(errno));
        exit(1);
    }

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        sprite_t* sprite;
        anm_script_t* script;
        long base = file_tell(stream);
        unsigned int namepad = 0;
        static const char padding[16] = "";
        unsigned int j;
        unsigned int spriteoffset;

        namepad = (16 - strlen(entry->name) % 16);

        unsigned int sprite_count = 0;
        list_for_each(&entry->sprites, sprite)
            ++sprite_count;

        unsigned int script_count = 0;
        list_for_each(&entry->scripts, script)
            ++script_count;

        file_seek(stream, base +
                          sizeof(anm_header06_t) +
                          sprite_count * sizeof(uint32_t) +
                          script_count * sizeof(anm_offset_t));

        entry->header->nameoffset = file_tell(stream) - base;
        file_write(stream, entry->name, strlen(entry->name));
        file_write(stream, padding, namepad);

        if (entry->name2 && entry->header->version == 0) {
            namepad = (16 - strlen(entry->name2) % 16);

            entry->header->y = file_tell(stream) - base;
            file_write(stream, entry->name2, strlen(entry->name2));
            file_write(stream, padding, namepad);
        }

        spriteoffset = file_tell(stream) - base;

        list_for_each(&entry->sprites, sprite)
            file_write(stream, sprite, sizeof(*sprite));

        list_for_each(&entry->scripts, script) {
            script->offset->offset = file_tell(stream) - base;

            anm_instr_t* instr;
            list_for_each(&script->instrs, instr) {
                if (entry->header->version == 0) {
                    anm_instr0_t new_instr;
                    new_instr.time = instr->time;
                    new_instr.type = instr->type;
                    new_instr.length = instr->length;
                    file_write(stream, &new_instr, sizeof(new_instr));
                    if (new_instr.length) {
                        file_write(stream,
                            instr->data,
                            new_instr.length);
                    }
                } else {
                    if (instr->type == 0xffff) {
                        instr->length = 0;
                        file_write(stream, instr, sizeof(*instr));
                    } else {
                        instr->length += sizeof(*instr);
                        file_write(stream, instr, instr->length);
                    }
                }
            }

            if (entry->header->version == 0) {
                anm_instr0_t sentinel = { 0, 0, 0 };
                file_write(stream, &sentinel, sizeof(sentinel));
            } else {
                anm_instr_t sentinel = { 0xffff, 0, 0, 0 };
                file_write(stream, &sentinel, sizeof(sentinel));
            }
        }

        if (entry->header->hasdata) {
            entry->header->thtxoffset = file_tell(stream) - base;

            file_write(stream, entry->thtx, sizeof(thtx_header_t));
            file_write(stream, entry->data, entry->thtx->size);
        }

        if (list_is_last_iteration())
            entry->header->nextoffset = 0;
        else
            entry->header->nextoffset = file_tell(stream) - base;

        entry->header->sprites = sprite_count;
        entry->header->scripts = script_count;

        file_seek(stream, base);

        if (entry->header->version >= 7) {
            convert_header_to_11(entry->header);
            file_write(stream, entry->header, sizeof(anm_header06_t));
            convert_header_to_old(entry->header);
        } else {
            file_write(stream, entry->header, sizeof(anm_header06_t));
        }

        for (j = 0; j < sprite_count; ++j) {
            uint32_t ofs = spriteoffset + j * sizeof(sprite_t);
            file_write(stream, &ofs, sizeof(uint32_t));
        }

        list_for_each(&entry->scripts, script) {
            file_write(stream, script->offset, sizeof(*script->offset));
        }

        file_seek(stream, base + entry->header->nextoffset);
    }

    fclose(stream);
}